

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::handleMessage
          (RunContext *this,AssertionInfo *info,OfType resultType,StringRef *message,
          AssertionReaction *reaction)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 uVar6;
  pointer pIVar7;
  undefined4 in_EDX;
  undefined8 *in_RSI;
  long in_RDI;
  AssertionResult assertionResult;
  AssertionResultData data;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  AssertionInfo *info_00;
  RunContext *this_00;
  undefined4 in_stack_fffffffffffffea0;
  LazyExpression *this_01;
  AssertionResultData *in_stack_fffffffffffffeb0;
  StringRef *in_stack_fffffffffffffeb8;
  undefined1 local_b0 [56];
  AssertionResult *in_stack_ffffffffffffff88;
  RunContext *in_stack_ffffffffffffff90;
  
  pIVar7 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x30f657);
  (*pIVar7->_vptr_IStreamingReporter[9])();
  *(undefined4 *)(in_RDI + 400) = *(undefined4 *)(in_RSI + 6);
  uVar1 = *in_RSI;
  uVar2 = in_RSI[1];
  uVar3 = in_RSI[2];
  uVar4 = in_RSI[3];
  uVar5 = in_RSI[5];
  *(undefined8 *)(in_RDI + 0x180) = in_RSI[4];
  *(undefined8 *)(in_RDI + 0x188) = uVar5;
  *(undefined8 *)(in_RDI + 0x170) = uVar3;
  *(undefined8 *)(in_RDI + 0x178) = uVar4;
  *(undefined8 *)(in_RDI + 0x160) = uVar1;
  *(undefined8 *)(in_RDI + 0x168) = uVar2;
  this_01 = (LazyExpression *)(local_b0 + 0x20);
  LazyExpression::LazyExpression(this_01,false);
  AssertionResultData::AssertionResultData
            (in_stack_fffffffffffffeb0,(OfType)((ulong)this_01 >> 0x20),
             (LazyExpression *)CONCAT44(in_EDX,in_stack_fffffffffffffea0));
  StringRef::operator_cast_to_string(in_stack_fffffffffffffeb8);
  this_00 = (RunContext *)(local_b0 + 0x30);
  info_00 = (AssertionInfo *)local_b0;
  std::__cxx11::string::operator=((string *)this_00,(string *)info_00);
  std::__cxx11::string::~string((string *)info_00);
  AssertionResult::AssertionResult
            ((AssertionResult *)this_00,info_00,
             (AssertionResultData *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  assertionEnded(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  uVar6 = AssertionResult::isOk
                    ((AssertionResult *)
                     CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  if (!(bool)uVar6) {
    populateReaction(this_00,(AssertionReaction *)info_00);
  }
  AssertionResult::~AssertionResult((AssertionResult *)0x30f7b4);
  AssertionResultData::~AssertionResultData
            ((AssertionResultData *)CONCAT17(uVar6,in_stack_fffffffffffffe80));
  return;
}

Assistant:

void RunContext::handleMessage(
            AssertionInfo const& info,
            ResultWas::OfType resultType,
            StringRef const& message,
            AssertionReaction& reaction
    ) {
        m_reporter->assertionStarting( info );

        m_lastAssertionInfo = info;

        AssertionResultData data( resultType, LazyExpression( false ) );
        data.message = static_cast<std::string>(message);
        AssertionResult assertionResult{ m_lastAssertionInfo, data };
        assertionEnded( assertionResult );
        if( !assertionResult.isOk() )
            populateReaction( reaction );
    }